

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O1

size_t asio::detail::
       write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t>
                 (long s,long *buffers,undefined8 param_3,error_code *param_4)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  error_category *peVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  
  peVar4 = (error_category *)std::_V2::system_category();
  param_4->_M_value = 0;
  param_4->_M_cat = peVar4;
  lVar2 = *buffers;
  uVar3 = buffers[1];
  sVar7 = 0;
  do {
    if (uVar3 <= sVar7) {
      return sVar7;
    }
    iVar1 = param_4->_M_value;
    if (iVar1 == 0) {
      uVar5 = sVar7;
      if (uVar3 < sVar7) {
        uVar5 = uVar3;
      }
      sVar6 = uVar3 - uVar5;
      if (0xffff < sVar6) {
        sVar6 = 0x10000;
      }
      sVar6 = socket_ops::sync_send1
                        (*(socket_type *)(s + 8),*(state_type *)(s + 0xc),(void *)(lVar2 + uVar5),
                         sVar6,0,param_4);
      sVar7 = sVar7 + sVar6;
    }
  } while (iVar1 == 0);
  return sVar7;
}

Assistant:

std::size_t write_buffer_sequence(SyncWriteStream& s,
      const ConstBufferSequence& buffers, const ConstBufferIterator&,
      CompletionCondition completion_condition, asio::error_code& ec)
  {
    ec = asio::error_code();
    asio::detail::consuming_buffers<const_buffer,
        ConstBufferSequence, ConstBufferIterator> tmp(buffers);
    while (!tmp.empty())
    {
      if (std::size_t max_size = detail::adapt_completion_condition_result(
            completion_condition(ec, tmp.total_consumed())))
        tmp.consume(s.write_some(tmp.prepare(max_size), ec));
      else
        break;
    }
    return tmp.total_consumed();;
  }